

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3983::test_or_inplace(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *r_00;
  
  r = roaring64_bitmap_create();
  r_00 = roaring64_bitmap_create();
  roaring64_bitmap_add(r,100000);
  roaring64_bitmap_add(r,0x186a1);
  roaring64_bitmap_add(r,200000);
  roaring64_bitmap_add(r,300000);
  roaring64_bitmap_add(r_00,0x186a1);
  roaring64_bitmap_add(r_00,200000);
  roaring64_bitmap_add(r_00,400000);
  roaring64_bitmap_or_inplace(r,r_00);
  assert_r64_valid((roaring64_bitmap_t *)r);
  _Var1 = roaring64_bitmap_contains(r,100000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r1, 100000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x456);
  _Var1 = roaring64_bitmap_contains(r,0x186a1);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r1, 100001)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x457);
  _Var1 = roaring64_bitmap_contains(r,200000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r1, 200000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x458);
  _Var1 = roaring64_bitmap_contains(r,300000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r1, 300000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x459);
  _Var1 = roaring64_bitmap_contains(r,400000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r1, 400000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x45a);
  roaring64_bitmap_free(r);
  roaring64_bitmap_free(r_00);
  return;
}

Assistant:

DEFINE_TEST(test_or_inplace) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    roaring64_bitmap_t* r2 = roaring64_bitmap_create();

    roaring64_bitmap_add(r1, 100000);
    roaring64_bitmap_add(r1, 100001);
    roaring64_bitmap_add(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    roaring64_bitmap_add(r2, 100001);
    roaring64_bitmap_add(r2, 200000);
    roaring64_bitmap_add(r2, 400000);

    roaring64_bitmap_or_inplace(r1, r2);

    assert_r64_valid(r1);
    assert_true(roaring64_bitmap_contains(r1, 100000));
    assert_true(roaring64_bitmap_contains(r1, 100001));
    assert_true(roaring64_bitmap_contains(r1, 200000));
    assert_true(roaring64_bitmap_contains(r1, 300000));
    assert_true(roaring64_bitmap_contains(r1, 400000));

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
}